

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_BOOL opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  opj_tcd_cblk_enc_t *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  opj_tcd_tile_t *poVar9;
  opj_tcd_tilecomp_t *poVar10;
  opj_tcd_resolution_t *poVar11;
  opj_tcd_precinct_t *poVar12;
  opj_tcd_cblk_enc_t *poVar13;
  opj_tcd_pass_t *poVar14;
  bool bVar15;
  OPJ_BOOL OVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  opj_tcd_layer_t *poVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  OPJ_UINT32 OVar25;
  uint uVar26;
  OPJ_UINT32 OVar27;
  ulong uVar28;
  OPJ_BYTE *pOVar29;
  uint uVar30;
  OPJ_FLOAT64 OVar31;
  double dVar32;
  OPJ_BOOL local_b0;
  
  poVar9 = tcd->tcd_image->tiles;
  poVar9->distolayer[layno] = 0.0;
  uVar2 = poVar9->numcomps;
  local_b0 = 1;
  for (uVar23 = 0; uVar23 != uVar2; uVar23 = uVar23 + 1) {
    poVar10 = poVar9->comps;
    uVar3 = poVar10[uVar23].numresolutions;
    for (uVar22 = 0; uVar22 != uVar3; uVar22 = uVar22 + 1) {
      poVar11 = poVar10[uVar23].resolutions;
      uVar4 = poVar11[uVar22].numbands;
      for (uVar17 = 0; uVar17 != uVar4; uVar17 = uVar17 + 1) {
        OVar16 = opj_tcd_is_band_empty(poVar11[uVar22].bands + uVar17);
        if (OVar16 == 0) {
          OVar5 = poVar11[uVar22].ph;
          OVar6 = poVar11[uVar22].pw;
          for (uVar21 = 0; uVar21 != OVar5 * OVar6; uVar21 = uVar21 + 1) {
            poVar12 = poVar11[uVar22].bands[uVar17].precincts;
            OVar7 = poVar12[uVar21].ch;
            OVar8 = poVar12[uVar21].cw;
            for (uVar18 = 0; uVar18 != OVar7 * OVar8; uVar18 = uVar18 + 1) {
              poVar13 = poVar12[uVar21].cblks.enc;
              poVar1 = poVar13 + uVar18;
              if (layno == 0) {
                poVar1->numpassesinlayers = 0;
              }
              if (0.0 <= (double)thresh) {
                uVar30 = poVar1->numpassesinlayers;
                uVar28 = (ulong)uVar30;
                lVar19 = uVar28 * 0x18 + 8;
                uVar26 = uVar30;
                while (uVar28 < poVar1->totalpasses) {
                  poVar14 = poVar1->passes;
                  uVar24 = *(uint *)((long)poVar14 + lVar19 + -8);
                  if (uVar26 == 0) {
                    dVar32 = *(double *)((long)&poVar14->rate + lVar19);
                  }
                  else {
                    uVar24 = uVar24 - poVar14[uVar26 - 1].rate;
                    dVar32 = *(double *)((long)&poVar14->rate + lVar19) -
                             (double)poVar14[uVar26 - 1].distortiondec;
                  }
                  if (uVar24 == 0) {
                    bVar15 = dVar32 != 0.0;
                  }
                  else {
                    bVar15 = (double)thresh - dVar32 / (double)uVar24 < 2.220446049250313e-16;
                  }
                  uVar28 = uVar28 + 1;
                  uVar24 = (uint)uVar28;
                  if (!bVar15) {
                    uVar24 = uVar26;
                  }
                  uVar26 = uVar24;
                  lVar19 = lVar19 + 0x18;
                }
              }
              else {
                uVar30 = poVar1->numpassesinlayers;
                uVar26 = poVar1->totalpasses;
              }
              poVar20 = poVar13[uVar18].layers + layno;
              OVar27 = uVar26 - uVar30;
              OVar25 = poVar20->numpasses;
              if (poVar20->numpasses != OVar27) {
                poVar20->numpasses = OVar27;
                local_b0 = 0;
                OVar25 = OVar27;
              }
              if (OVar25 == 0) {
                poVar20->disto = 0.0;
              }
              else {
                uVar24 = uVar26 - 1;
                poVar14 = poVar1->passes;
                OVar25 = poVar14[uVar24].rate;
                if (uVar30 == 0) {
                  pOVar29 = poVar1->data;
                  OVar31 = poVar14[uVar24].distortiondec;
                }
                else {
                  OVar25 = OVar25 - poVar14[uVar30 - 1].rate;
                  pOVar29 = poVar1->data + poVar14[uVar30 - 1].rate;
                  OVar31 = (OPJ_FLOAT64)
                           ((double)poVar14[uVar24].distortiondec -
                           (double)poVar14[uVar30 - 1].distortiondec);
                }
                poVar20->len = OVar25;
                poVar20->data = pOVar29;
                poVar20->disto = OVar31;
                poVar9->distolayer[layno] =
                     (OPJ_FLOAT64)((double)OVar31 + (double)poVar9->distolayer[layno]);
                if (final != 0) {
                  poVar1->numpassesinlayers = uVar26;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_b0;
}

Assistant:

static
OPJ_BOOL opj_tcd_makelayer(opj_tcd_t *tcd,
                           OPJ_UINT32 layno,
                           OPJ_FLOAT64 thresh,
                           OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_UINT32 passno;

    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    OPJ_BOOL layer_allocation_is_same = OPJ_TRUE;

    tcd_tile->distolayer[layno] = 0;

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;

                        if (thresh < 0) {
                            /* Special value to indicate to use all passes */
                            n = cblk->totalpasses;
                        } else {
                            for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                OPJ_UINT32 dr;
                                OPJ_FLOAT64 dd;
                                opj_tcd_pass_t *pass = &cblk->passes[passno];

                                if (n == 0) {
                                    dr = pass->rate;
                                    dd = pass->distortiondec;
                                } else {
                                    dr = pass->rate - cblk->passes[n - 1].rate;
                                    dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                }

                                if (!dr) {
                                    if (dd != 0) {
                                        n = passno + 1;
                                    }
                                    continue;
                                }
                                if (thresh - (dd / dr) <
                                        DBL_EPSILON) { /* do not rely on float equality, check with DBL_EPSILON margin */
                                    n = passno + 1;
                                }
                            }
                        }

                        if (layer->numpasses != n - cblk->numpassesinlayers) {
                            layer_allocation_is_same = OPJ_FALSE;
                            layer->numpasses = n - cblk->numpassesinlayers;
                        }

                        if (!layer->numpasses) {
                            layer->disto = 0;
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                            layer->disto = cblk->passes[n - 1].distortiondec;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                            layer->disto = cblk->passes[n - 1].distortiondec -
                                           cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                        }

                        tcd_tile->distolayer[layno] += layer->disto;

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
    return layer_allocation_is_same;
}